

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

void __thiscall
boost::xpressive::
match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::set_prefix_suffix_
          (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 begin,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          end)

{
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  char *pcVar2;
  type tVar3;
  node_base *pnVar4;
  const_reference pvVar5;
  
  if ((this->base_).super_type.m_initialized == false) {
    (this->base_).super_type.m_initialized = true;
  }
  (this->base_).super_type.m_storage.dummy_.aligner_ = (type)begin._M_current;
  this_00 = &this->sub_matches_;
  pvVar5 = detail::
           sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_00,0);
  pcVar1 = (pvVar5->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current;
  pvVar5 = detail::
           sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_00,0);
  pcVar2 = (pvVar5->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).first._M_current;
  if ((this->prefix_).super_type.m_initialized == false) {
    (this->prefix_).super_type.m_initialized = true;
  }
  (this->prefix_).super_type.m_storage.dummy_.aligner_ = (type)begin._M_current;
  *(char **)((long)&(this->prefix_).super_type.m_storage.dummy_ + 8) = pcVar1;
  (this->prefix_).super_type.m_storage.dummy_.data[0x10] = pcVar2 != begin._M_current;
  pvVar5 = detail::
           sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_00,0);
  tVar3 = (type)(pvVar5->
                super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ).second._M_current;
  pvVar5 = detail::
           sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_00,0);
  pcVar1 = (pvVar5->
           super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).second._M_current;
  if ((this->suffix_).super_type.m_initialized == false) {
    (this->suffix_).super_type.m_initialized = true;
  }
  (this->suffix_).super_type.m_storage.dummy_.aligner_ = tVar3;
  *(char **)((long)&(this->suffix_).super_type.m_storage.dummy_ + 8) = end._M_current;
  (this->suffix_).super_type.m_storage.dummy_.data[0x10] = pcVar1 != end._M_current;
  pnVar4 = &(this->nested_results_).
            super_list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._sentry;
  while (pnVar4 = pnVar4->_next, pnVar4 != (node_base *)&this->nested_results_) {
    set_prefix_suffix_((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(pnVar4 + 1),begin,end);
  }
  return;
}

Assistant:

void set_prefix_suffix_(BidiIter begin, BidiIter end)
    {
        this->base_ = begin;
        this->prefix_ = sub_match<BidiIter>(begin, this->sub_matches_[ 0 ].first, begin != this->sub_matches_[ 0 ].first);
        this->suffix_ = sub_match<BidiIter>(this->sub_matches_[ 0 ].second, end, this->sub_matches_[ 0 ].second != end);

        typename nested_results_type::iterator ibegin = this->nested_results_.begin();
        typename nested_results_type::iterator iend = this->nested_results_.end();
        for( ; ibegin != iend; ++ibegin )
        {
            ibegin->set_prefix_suffix_(begin, end);
        }
    }